

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewConversion.h
# Opt level: O0

double gmlc::utilities::numConv<double>(string_view V)

{
  double dVar1;
  size_t *in_stack_00000030;
  undefined1 in_stack_00000038 [16];
  
  dVar1 = strViewToFloat<double>((string_view)in_stack_00000038,in_stack_00000030);
  return dVar1;
}

Assistant:

inline double numConv(std::string_view V)
{
#ifdef __cpp_lib_to_chars
    return strViewToFloat<double>(V);
#elif defined USE_BOOST_SPIRIT && USE_BOOST_SPIRIT > 0
    namespace x3 = boost::spirit::x3;
    double retVal = -1e49;
    x3::parse(V.cbegin(), V.cend(), x3::double_, retVal);
    return retVal;
#else
    return std::stod(std::string(V.data(), V.length()));
#endif
}